

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# periodic_waveform_generation.cc
# Opt level: O2

bool __thiscall
sptk::PeriodicWaveformGeneration::Get
          (PeriodicWaveformGeneration *this,double *sin,double *cos,double *sawtooth,double *pitch)

{
  double dVar1;
  InputSourceInterpolationWithMagicNumber *pIVar2;
  int iVar3;
  bool bVar4;
  double dVar5;
  double dVar6;
  vector<double,_std::allocator<double>_> tmp;
  double local_60;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  if (this->is_valid_ == true) {
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_start = (double *)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    iVar3 = (*(this->input_source_->super_InputSourceInterface)._vptr_InputSourceInterface[4])();
    if (((char)iVar3 == '\0') || (*local_48._M_impl.super__Vector_impl_data._M_start < 0.0)) {
      bVar4 = false;
    }
    else {
      bVar4 = true;
      local_60 = *local_48._M_impl.super__Vector_impl_data._M_start;
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
    if (bVar4) {
      pIVar2 = this->input_source_;
      dVar1 = pIVar2->magic_number_;
      dVar6 = local_60;
      if (this->strict_ == false) {
        if (((dVar1 == local_60) && (!NAN(dVar1) && !NAN(local_60))) && (this->extending_ == true))
        {
          dVar6 = this->voiced_pitch_;
        }
      }
      dVar5 = dVar1;
      if (pitch != (double *)0x0) {
        *pitch = dVar6;
        dVar5 = pIVar2->magic_number_;
      }
      if ((dVar5 == dVar6) && (!NAN(dVar5) && !NAN(dVar6))) {
        this->phase_ = 0.0;
        if (sin != (double *)0x0) {
          *sin = this->unvoiced_value_;
        }
        if (cos != (double *)0x0) {
          *cos = this->unvoiced_value_;
        }
        if (sawtooth == (double *)0x0) {
          return true;
        }
        *sawtooth = this->unvoiced_value_;
        return true;
      }
      if (sin != (double *)0x0) {
        dVar5 = ::sin(this->phase_);
        *sin = dVar5;
      }
      if (cos != (double *)0x0) {
        dVar5 = ::cos(this->phase_);
        *cos = dVar5;
      }
      if (sawtooth != (double *)0x0) {
        *sawtooth = this->phase_ / 3.141592653589793 + -1.0;
      }
      bVar4 = this->strict_ == false;
      if (bVar4) {
        this->extending_ = true;
        this->voiced_pitch_ = dVar6;
      }
      dVar5 = this->phase_;
      dVar6 = 6.283185307179586 / dVar6 + dVar5;
      this->phase_ = dVar6;
      if ((bVar4 && local_60 == dVar1) &&
         (((dVar5 <= 3.141592653589793 && (3.141592653589793 <= dVar6)) ||
          ((dVar5 <= 6.283185307179586 && (6.283185307179586 <= dVar6)))))) {
        this->extending_ = false;
      }
      if (dVar6 <= 6.283185307179586) {
        return true;
      }
      this->phase_ = dVar6 + -6.283185307179586;
      return true;
    }
  }
  return false;
}

Assistant:

bool PeriodicWaveformGeneration::Get(double* sin, double* cos, double* sawtooth,
                                     double* pitch) {
  if (!is_valid_) {
    return false;
  }

  // Get pitch.
  double pitch_in_current_point;
  {
    std::vector<double> tmp;
    if (!input_source_->Get(&tmp) || tmp[0] < 0.0) {
      return false;
    }
    pitch_in_current_point = tmp[0];
  }

  const bool unvoiced(input_source_->GetMagicNumber() ==
                      pitch_in_current_point);
  if (!strict_ && unvoiced && extending_) {
    pitch_in_current_point = voiced_pitch_;
  }

  if (pitch) {
    *pitch = pitch_in_current_point;
  }

  // If unvoiced point, return zero.
  if (input_source_->GetMagicNumber() == pitch_in_current_point) {
    phase_ = 0.0;
    if (sin) {
      *sin = unvoiced_value_;
    }
    if (cos) {
      *cos = unvoiced_value_;
    }
    if (sawtooth) {
      *sawtooth = unvoiced_value_;
    }
    return true;
  }

  if (sin) {
    *sin = std::sin(phase_);
  }
  if (cos) {
    *cos = std::cos(phase_);
  }
  if (sawtooth) {
    *sawtooth = phase_ / sptk::kPi - 1.0;
  }

  if (!strict_) {
    extending_ = true;
    voiced_pitch_ = pitch_in_current_point;
  }

  // Proceed phase.
  const double prev_phase(phase_);
  phase_ += sptk::kTwoPi / pitch_in_current_point;
  if (!strict_ && unvoiced &&
      ((prev_phase <= sptk::kPi && sptk::kPi <= phase_) ||
       (prev_phase <= sptk::kTwoPi && sptk::kTwoPi <= phase_))) {
    extending_ = false;
  }
  if (sptk::kTwoPi < phase_) {
    phase_ -= sptk::kTwoPi;
  }

  return true;
}